

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprSrcCount(Walker *pWalker,Expr *pExpr)

{
  int *piVar1;
  SrcCount *pSVar2;
  SrcList *pSVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  if ((pExpr->op | 2) == 0x9a) {
    pSVar2 = (pWalker->u).pSrcCount;
    pSVar3 = pSVar2->pSrc;
    uVar5 = 0;
    if (pSVar3 != (SrcList *)0x0) {
      uVar5 = pSVar3->nSrc;
    }
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = 0;
    }
    uVar4 = 0;
    do {
      if (uVar6 * 0x70 + 0x70 == uVar4 + 0x70) {
        pSVar2->nOther = pSVar2->nOther + 1;
        return 0;
      }
      piVar1 = (int *)((long)&pSVar3->a[0].iCursor + uVar4);
      uVar4 = uVar4 + 0x70;
    } while (pExpr->iTable != *piVar1);
    pSVar2->nThis = pSVar2->nThis + 1;
  }
  return 0;
}

Assistant:

static int exprSrcCount(Walker *pWalker, Expr *pExpr){
  /* The NEVER() on the second term is because sqlite3FunctionUsesThisSrc()
  ** is always called before sqlite3ExprAnalyzeAggregates() and so the
  ** TK_COLUMNs have not yet been converted into TK_AGG_COLUMN.  If
  ** sqlite3FunctionUsesThisSrc() is used differently in the future, the
  ** NEVER() will need to be removed. */
  if( pExpr->op==TK_COLUMN || NEVER(pExpr->op==TK_AGG_COLUMN) ){
    int i;
    struct SrcCount *p = pWalker->u.pSrcCount;
    SrcList *pSrc = p->pSrc;
    int nSrc = pSrc ? pSrc->nSrc : 0;
    for(i=0; i<nSrc; i++){
      if( pExpr->iTable==pSrc->a[i].iCursor ) break;
    }
    if( i<nSrc ){
      p->nThis++;
    }else{
      p->nOther++;
    }
  }
  return WRC_Continue;
}